

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O1

bool __thiscall
llama_model_loader::get_key<float>(llama_model_loader *this,string *key,float *result,bool required)

{
  gguf_context *ctx;
  bool bVar1;
  int k;
  iterator iVar2;
  runtime_error *this_00;
  llama_model_kv_override *ovrd;
  string local_50;
  
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->kv_overrides)._M_h,key);
  ovrd = (llama_model_kv_override *)
         ((long)iVar2.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>,_true>
                ._M_cur + 0x28);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>,_true>
      ._M_cur == (__node_type *)0x0) {
    ovrd = (llama_model_kv_override *)0x0;
  }
  ctx = (this->meta)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
        super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
        super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl;
  k = gguf_find_key(ctx,(key->_M_dataplus)._M_p);
  bVar1 = GGUFMeta::GKV<float>::set(ctx,k,result,ovrd);
  if (!required || bVar1) {
    return bVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  format_abi_cxx11_(&local_50,"key not found in model: %s",(key->_M_dataplus)._M_p);
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool llama_model_loader::get_key(const std::string & key, T & result, bool required) {
        auto it = kv_overrides.find(key);

        const struct llama_model_kv_override * override =
            it != kv_overrides.end() ? &it->second : nullptr;

        const bool found = GGUFMeta::GKV<T>::set(meta.get(), key, result, override);

        if (required && !found) {
            throw std::runtime_error(format("key not found in model: %s", key.c_str()));
        }

        return found;
    }